

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O0

DWORD GetModuleFileNameW(HMODULE hModule,LPWSTR lpFileName,DWORD nSize)

{
  BOOL BVar1;
  DWORD DVar2;
  LPWSTR lpString;
  LPWSTR wide_name;
  DWORD retval;
  INT name_length;
  DWORD nSize_local;
  LPWSTR lpFileName_local;
  HMODULE hModule_local;
  
  wide_name._4_4_ = 0;
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  LockModuleList();
  wcscpy_s((char16_t_conflict *)lpFileName,(ulong)nSize,(char16_t_conflict *)L"");
  if ((hModule == (HMODULE)0x0) || (BVar1 = LOADValidateModule((MODSTRUCT *)hModule), BVar1 != 0)) {
    lpString = LOADGetModuleFileName((MODSTRUCT *)hModule);
    if (lpString == (LPWSTR)0x0) {
      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        abort();
      }
      SetLastError(0x54f);
    }
    else {
      DVar2 = lstrlenW(lpString);
      if ((int)DVar2 < (int)nSize) {
        wcscpy_s((char16_t_conflict *)lpFileName,(ulong)nSize,(char16_t_conflict *)lpString);
        wide_name._4_4_ = DVar2;
        if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
          abort();
        }
      }
      else {
        if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
          abort();
        }
        SetLastError(0x7a);
      }
    }
  }
  else {
    if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
      abort();
    }
    SetLastError(6);
  }
  UnlockModuleList();
  if ((PAL_InitializeChakraCoreCalled & 1U) != 0) {
    return wide_name._4_4_;
  }
  abort();
}

Assistant:

DWORD
PALAPI
GetModuleFileNameW(
    IN HMODULE hModule,
    OUT LPWSTR lpFileName,
    IN DWORD nSize)
{
    INT name_length;
    DWORD retval = 0;
    LPWSTR wide_name = nullptr;

    PERF_ENTRY(GetModuleFileNameW);
    ENTRY("GetModuleFileNameW (hModule=%p, lpFileName=%p, nSize=%u)\n",
          hModule, lpFileName, nSize);

    LockModuleList();

    wcscpy_s(lpFileName, nSize, W(""));

    if (hModule && !LOADValidateModule((MODSTRUCT *)hModule))
    {
        TRACE("Can't find name for invalid module handle %p\n", hModule);
        SetLastError(ERROR_INVALID_HANDLE);
        goto done;
    }
    wide_name = LOADGetModuleFileName((MODSTRUCT *)hModule);

    if (!wide_name)
    {
        TRACE("Can't find name for valid module handle %p\n", hModule);
        SetLastError(ERROR_INTERNAL_ERROR);
        goto done;
    }

    /* Copy module name into supplied buffer */

    name_length = lstrlenW(wide_name);
    if (name_length >= (INT)nSize)
    {
        TRACE("Buffer too small (%u) to copy module's file name (%u).\n", nSize, name_length);
        SetLastError(ERROR_INSUFFICIENT_BUFFER);
        goto done;
    }

    wcscpy_s(lpFileName, nSize, wide_name);

    TRACE("file name of module %p is %S\n", hModule, lpFileName);
    retval = name_length;
done:
    UnlockModuleList();
    LOGEXIT("GetModuleFileNameW returns DWORD %u\n", retval);
    PERF_EXIT(GetModuleFileNameW);
    return retval;
}